

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O2

vector<kiste::line_t,_std::allocator<kiste::line_t>_> *
kiste::parse(vector<kiste::line_t,_std::allocator<kiste::line_t>_> *__return_storage_ptr__,
            parse_context *ctx)

{
  istream *piVar1;
  pointer plVar2;
  bool bVar3;
  ulong uVar4;
  reference this;
  reference this_00;
  parse_error *this_01;
  line_data_t line_data;
  line_t local_e0;
  
  (__return_storage_ptr__->super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    piVar1 = ctx->_is;
    if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) != 0) break;
    ctx->_line_no = ctx->_line_no + 1;
    std::getline<char,std::char_traits<char>,std::allocator<char>>(piVar1,(string *)&ctx->_line);
    parse_line(&line_data,ctx);
    parse_context::update(ctx,&line_data);
    line_t::line_t(&local_e0,ctx,&line_data);
    std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>::emplace_back<kiste::line_t>
              (__return_storage_ptr__,&local_e0);
    line_data_t::~line_data_t(&local_e0.super_line_data_t);
    uVar4 = ((long)(__return_storage_ptr__->
                   super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(__return_storage_ptr__->
                  super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>)._M_impl.
                  super__Vector_impl_data._M_start) / 0xb0;
    if (2 < uVar4) {
      this = std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>::at
                       (__return_storage_ptr__,uVar4 - 1);
      this_00 = std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>::at
                          (__return_storage_ptr__,
                           ((long)(__return_storage_ptr__->
                                  super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(__return_storage_ptr__->
                                 super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>).
                                 _M_impl.super__Vector_impl_data._M_start) / 0xb0 - 2);
      bVar3 = line_t::ends_with_text(this_00);
      this->_previous_line_ends_with_text = bVar3;
      bVar3 = line_t::starts_with_text(this);
      this_00->_next_line_starts_with_text = bVar3;
    }
    line_data_t::~line_data_t(&line_data);
  }
  plVar2 = (__return_storage_ptr__->
           super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (((__return_storage_ptr__->super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>).
       _M_impl.super__Vector_impl_data._M_start != plVar2) && (plVar2[-1]._curly_level != 0)) {
    this_01 = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error(this_01,"not enough closing curly braces");
    __cxa_throw(this_01,&parse_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

auto parse(parse_context& ctx) -> std::vector<line_t>
  {
    auto lines = std::vector<line_t>{};

    while (ctx._is.good())
    {
      ++ctx._line_no;
      getline(ctx._is, ctx._line);

      const auto line_data = parse_line(ctx);
      ctx.update(line_data);
      lines.push_back({ctx, line_data});

      if (lines.size() > 2)
      {
        auto& line = lines.at(lines.size() - 1);
        auto& previous_line = lines.at(lines.size() - 2);
        line._previous_line_ends_with_text = previous_line.ends_with_text();
        previous_line._next_line_starts_with_text = line.starts_with_text();
      }
    }
    if (not lines.empty() and lines.back()._curly_level)
    {
      throw parse_error("not enough closing curly braces");
    }

    return lines;
  }